

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::UntypedMessage::Decode
          (UntypedMessage *this,CodedInputStream *stream,optional<int> current_group)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  uint32_t uVar4;
  UntypedMessage *value;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
  aVar5;
  long lVar6;
  ulong uVar7;
  ulong in_RCX;
  byte *pbVar8;
  int original_buffer_size;
  char cVar10;
  uint wire_type;
  pair<unsigned_long,_bool> pVar11;
  int32_t field_number;
  vector<int,_std::allocator<int>_> group_stack;
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*> group_desc;
  UntypedMessage group;
  uint local_9c;
  int *local_98;
  iterator iStack_90;
  int *local_88;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
  local_78;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_3
  local_70;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_3
  local_68;
  raw_hash_set<_2385b75b_> local_60;
  ulong local_40;
  code *local_38;
  byte *pbVar9;
  
  local_98 = (int *)0x0;
  iStack_90._M_current = (int *)0x0;
  local_88 = (int *)0x0;
  local_38 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  local_40 = in_RCX;
LAB_002d4ec2:
  do {
    pbVar9 = *(byte **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                       super__Optional_payload_base<int>;
    if (pbVar9 < *(byte **)((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
                                  super__Optional_payload_base<int> + 8)) {
      uVar4 = (uint32_t)*pbVar9;
      if ((char)*pbVar9 < '\0') goto LAB_002d4edf;
      *(byte **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> = pbVar9 + 1;
    }
    else {
      uVar4 = 0;
LAB_002d4edf:
      uVar4 = io::CodedInputStream::ReadTagFallback
                        ((CodedInputStream *)
                         current_group.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>,uVar4);
    }
    *(uint32_t *)
     ((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int> + 0x20) = uVar4;
    if (uVar4 == 0) {
LAB_002d526c:
      this->desc_ = (Message *)0x1;
      goto LAB_002d5273;
    }
    local_9c = uVar4 >> 3;
    wire_type = uVar4 & 7;
    if ((wire_type == 4) && (local_98 == iStack_90._M_current)) {
      if ((local_40 & 0x100000000) == 0) {
        MakeEndGroupWithoutGroupError((json_internal *)this,local_9c);
      }
      else {
        if (local_9c == (uint)local_40) goto LAB_002d526c;
        MakeEndGroupMismatchError((json_internal *)this,local_9c,(uint)local_40);
      }
      goto LAB_002d5273;
    }
    value = (UntypedMessage *)ResolverPool::Message::FindField((Message *)stream->buffer_,local_9c);
    if (value == (UntypedMessage *)0x0 || local_98 != iStack_90._M_current) {
      switch(wire_type) {
      case 0:
        pcVar2 = *(char **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int>;
        if ((pcVar2 < *(char **)((long)current_group.super__Optional_base<int,_true,_true>.
                                       _M_payload.super__Optional_payload_base<int> + 8)) &&
           (-1 < *pcVar2)) {
          *(char **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int> = pcVar2 + 1;
        }
        else {
          pVar11 = io::CodedInputStream::ReadVarint64Fallback
                             ((CodedInputStream *)
                              current_group.super__Optional_base<int,_true,_true>._M_payload.
                              super__Optional_payload_base<int>);
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            MakeUnexpectedEofError();
            goto LAB_002d5273;
          }
        }
        goto LAB_002d4ec2;
      case 1:
        if (*(int *)((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int> + 8) -
            (int)*(long *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int> < 8) {
          bVar3 = io::CodedInputStream::ReadLittleEndian64Fallback
                            ((CodedInputStream *)
                             current_group.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>,(uint64_t *)&local_68);
          cVar10 = '\x02';
          if (!bVar3) {
            cVar10 = '\x01';
            MakeUnexpectedEofError();
          }
        }
        else {
          lVar6 = *(long *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int> + 8;
LAB_002d5166:
          *(long *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int> = lVar6;
          cVar10 = '\x02';
        }
        break;
      case 2:
        pbVar8 = *(byte **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int>;
        pbVar9 = *(byte **)((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
                                  super__Optional_payload_base<int> + 8);
        if (pbVar8 < pbVar9) {
          bVar1 = *pbVar8;
          uVar7 = (ulong)bVar1;
          uVar4 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002d51aa;
          pbVar8 = pbVar8 + 1;
          *(byte **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int> = pbVar8;
        }
        else {
          uVar4 = 0;
LAB_002d51aa:
          uVar7 = io::CodedInputStream::ReadVarint32Fallback
                            ((CodedInputStream *)
                             current_group.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>,uVar4);
          if ((long)uVar7 < 0) {
            MakeUnexpectedEofError();
            goto LAB_002d5273;
          }
          if ((int)uVar7 < 0) goto LAB_002d4ec2;
          pbVar8 = *(byte **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>;
          pbVar9 = *(byte **)((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
                                    super__Optional_payload_base<int> + 8);
        }
        original_buffer_size = (int)pbVar9 - (int)pbVar8;
        if (original_buffer_size < (int)uVar7) {
          io::CodedInputStream::SkipFallback
                    ((CodedInputStream *)
                     current_group.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int>,(int)uVar7,original_buffer_size);
        }
        else {
          *(byte **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int> = pbVar8 + (uVar7 & 0xffffffff);
        }
        goto LAB_002d4ec2;
      case 3:
        if (iStack_90._M_current == local_88) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_98,iStack_90,(int *)&local_9c);
        }
        else {
          *iStack_90._M_current = local_9c;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
        goto LAB_002d4ec2;
      case 4:
        if (local_98 == iStack_90._M_current) {
          MakeEndGroupWithoutGroupError((json_internal *)this,local_9c);
          goto LAB_002d5273;
        }
        if (local_9c != iStack_90._M_current[-1]) {
          MakeEndGroupMismatchError((json_internal *)this,local_9c,iStack_90._M_current[-1]);
          goto LAB_002d5273;
        }
        iStack_90._M_current = iStack_90._M_current + -1;
        goto LAB_002d4ec2;
      case 5:
        if (3 < *(int *)((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
                               super__Optional_payload_base<int> + 8) -
                (int)*(long *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                              super__Optional_payload_base<int>) {
          lVar6 = *(long *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int> + 4;
          goto LAB_002d5166;
        }
        bVar3 = io::CodedInputStream::ReadLittleEndian32Fallback
                          ((CodedInputStream *)
                           current_group.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int>,(uint32_t *)&local_68);
        cVar10 = '\x02';
        if (!bVar3) {
          cVar10 = '\x01';
          MakeUnexpectedEofError();
        }
        break;
      default:
switchD_002d4f5f_default:
        MakeUnknownWireTypeError((json_internal *)this,wire_type);
        goto LAB_002d5273;
      }
LAB_002d516f:
      if (cVar10 != '\x02') goto LAB_002d5273;
      goto LAB_002d4ec2;
    }
    switch(wire_type) {
    case 0:
      DecodeVarint(this,stream,
                   (Field *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int>);
      break;
    case 1:
      Decode64Bit(this,stream,
                  (Field *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int>);
      break;
    case 2:
      DecodeDelimited(this,stream,
                      (Field *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                               super__Optional_payload_base<int>);
      break;
    case 3:
      lVar6 = (value->fields_).super_raw_hash_map<_2385b75b_>.super_raw_hash_set<_2385b75b_>.
              settings_.
              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value
              .capacity_;
      if (*(int *)(lVar6 + 0x48) != 10) {
        MakeFieldNotGroupError((json_internal *)this,*(int *)(lVar6 + 0x50));
        goto LAB_002d5273;
      }
      ResolverPool::Field::MessageType((Field *)&local_78.status_);
      this->desc_ = (Message *)local_78;
      aVar5 = local_78;
      if (((ulong)local_78 & 1) == 0) {
        LOCK();
        *(int *)local_78 = *(int *)local_78 + 1;
        UNLOCK();
        aVar5.status_.rep_ = (Status)this->desc_;
      }
      if (aVar5 != (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
                    )0x1) {
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::~StatusOrData
                  ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
                   &local_78.status_);
        goto LAB_002d5273;
      }
      if (local_78 !=
          (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
           )0x1) {
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_78.status_);
        goto switchD_002d4f5f_caseD_4;
      }
      local_68 = local_70;
      local_60.settings_.
      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = 0;
      local_60.settings_.
      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ =
           0;
      local_60.settings_.
      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
      heap_or_soo_.heap.control = (ctrl_t *)local_38;
      Decode(this,(CodedInputStream *)&local_68,current_group);
      cVar10 = '\x01';
      if (this->desc_ == (Message *)0x1) {
        InsertField<google::protobuf::json_internal::UntypedMessage>(this,(Field *)stream,value);
        cVar10 = (this->desc_ == (Message *)0x1) * '\x04' + '\x01';
      }
      absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::~raw_hash_set(&local_60);
      absl::lts_20240722::internal_statusor::
      StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::~StatusOrData
                ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
                 &local_78.status_);
      if (cVar10 != '\x05') goto LAB_002d516f;
      goto LAB_002d4ec2;
    case 4:
switchD_002d4f5f_caseD_4:
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/json/internal/untyped_message.cc"
                 ,0x134);
      absl::lts_20240722::log_internal::LogMessage::operator<<
                ((LogMessage *)&local_68,(char (*) [12])"unreachable");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_68);
    case 5:
      Decode32Bit(this,stream,
                  (Field *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int>);
      break;
    default:
      goto switchD_002d4f5f_default;
    }
    if (this->desc_ != (Message *)0x1) {
LAB_002d5273:
      if (local_98 != (int *)0x0) {
        operator_delete(local_98,(long)local_88 - (long)local_98);
      }
      return (Status)(uintptr_t)this;
    }
  } while( true );
}

Assistant:

absl::Status UntypedMessage::Decode(io::CodedInputStream& stream,
                                    absl::optional<int32_t> current_group) {
  std::vector<int32_t> group_stack;
  while (true) {
    uint32_t tag = stream.ReadTag();
    if (tag == 0) {
      return absl::OkStatus();
    }

    int32_t field_number = tag >> 3;
    int32_t wire_type = tag & 7;

    // EGROUP markers can show up as "unknown fields", so we need to handle them
    // before we even do field lookup. Being inside of a group behaves as if a
    // special field has been added to the message.
    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP &&
        group_stack.empty()) {
      if (!current_group.has_value()) {
        return MakeEndGroupWithoutGroupError(field_number);
      }
      if (field_number != *current_group) {
        return MakeEndGroupMismatchError(field_number, *current_group);
      }
      return absl::OkStatus();
    }

    const auto* field = desc_->FindField(field_number);
    if (!group_stack.empty() || field == nullptr) {
      // Skip unknown field. If the group-stack is non-empty, we are in the
      // process of working through an unknown group.
      switch (wire_type) {
        case WireFormatLite::WIRETYPE_VARINT: {
          uint64_t x;
          if (!stream.ReadVarint64(&x)) {
            return MakeUnexpectedEofError();
          }
          continue;
        }
        case WireFormatLite::WIRETYPE_FIXED64: {
          uint64_t x;
          if (!stream.ReadLittleEndian64(&x)) {
            return MakeUnexpectedEofError();
          }
          continue;
        }
        case WireFormatLite::WIRETYPE_FIXED32: {
          uint32_t x;
          if (!stream.ReadLittleEndian32(&x)) {
            return MakeUnexpectedEofError();
          }
          continue;
        }
        case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
          uint32_t x;
          if (!stream.ReadVarint32(&x)) {
            return MakeUnexpectedEofError();
          }
          stream.Skip(x);
          continue;
        }
        case WireFormatLite::WIRETYPE_START_GROUP: {
          group_stack.push_back(field_number);
          continue;
        }
        case WireFormatLite::WIRETYPE_END_GROUP: {
          if (group_stack.empty()) {
            return MakeEndGroupWithoutGroupError(field_number);
          }
          if (field_number != group_stack.back()) {
            return MakeEndGroupMismatchError(field_number, group_stack.back());
          }
          group_stack.pop_back();
          continue;
        }
        default:
          return MakeUnknownWireTypeError(wire_type);
      }
    }
    switch (wire_type) {
      case WireFormatLite::WIRETYPE_VARINT:
        RETURN_IF_ERROR(DecodeVarint(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_FIXED64:
        RETURN_IF_ERROR(Decode64Bit(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_FIXED32:
        RETURN_IF_ERROR(Decode32Bit(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_LENGTH_DELIMITED:
        RETURN_IF_ERROR(DecodeDelimited(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_START_GROUP: {
        if (field->proto().kind() != Field::TYPE_GROUP) {
          return MakeFieldNotGroupError(field->proto().number());
        }
        auto group_desc = field->MessageType();
        RETURN_IF_ERROR(group_desc.status());

        UntypedMessage group(*group_desc);
        RETURN_IF_ERROR(group.Decode(stream, field_number));
        RETURN_IF_ERROR(InsertField(*field, std::move(group)));
        break;
      }
      case WireFormatLite::WIRETYPE_END_GROUP:
        ABSL_LOG(FATAL) << "unreachable";
        break;
      default:
        return MakeUnknownWireTypeError(wire_type);
    }
  }

  return absl::OkStatus();
}